

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlistwidget.cpp
# Opt level: O2

void QListWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  ScrollHint hint;
  QListWidgetItem *item;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      itemPressed((QListWidget *)_o,*_a[1]);
      return;
    case 1:
      itemClicked((QListWidget *)_o,*_a[1]);
      return;
    case 2:
      itemDoubleClicked((QListWidget *)_o,*_a[1]);
      return;
    case 3:
      itemActivated((QListWidget *)_o,*_a[1]);
      return;
    case 4:
      itemEntered((QListWidget *)_o,*_a[1]);
      return;
    case 5:
      itemChanged((QListWidget *)_o,*_a[1]);
      return;
    case 6:
      currentItemChanged((QListWidget *)_o,*_a[1],*_a[2]);
      return;
    case 7:
      currentTextChanged((QListWidget *)_o,(QString *)_a[1]);
      return;
    case 8:
      currentRowChanged((QListWidget *)_o,*_a[1]);
      return;
    case 9:
      itemSelectionChanged((QListWidget *)_o);
      return;
    case 10:
      item = *_a[1];
      hint = *_a[2];
      break;
    case 0xb:
      item = *_a[1];
      hint = EnsureVisible;
      break;
    case 0xc:
      clear((QListWidget *)_o);
      return;
    default:
      goto switchD_005227cb_caseD_3;
    }
    scrollToItem((QListWidget *)_o,item,hint);
    return;
  case ReadProperty:
    piVar1 = (int *)*_a;
    if (_id == 2) {
      *(undefined1 *)piVar1 = *(undefined1 *)(*(long *)(_o + 8) + 0x5c0);
    }
    else {
      if (_id == 1) {
        iVar3 = currentRow((QListWidget *)_o);
      }
      else {
        if (_id != 0) {
          return;
        }
        iVar3 = count((QListWidget *)_o);
      }
      *piVar1 = iVar3;
    }
    break;
  case WriteProperty:
    if (_id == 2) {
      *(char *)(*(long *)(_o + 8) + 0x5c0) = (char)**_a;
    }
    else if (_id == 1) {
      setCurrentRow((QListWidget *)_o,**_a);
      return;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                      ((QtMocHelpers *)_a,(void **)itemPressed,0,0);
    if ((((((!bVar2) &&
           (bVar2 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                              ((QtMocHelpers *)_a,(void **)itemClicked,0,1), !bVar2)) &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                             ((QtMocHelpers *)_a,(void **)itemDoubleClicked,0,2), !bVar2)) &&
         ((bVar2 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                             ((QtMocHelpers *)_a,(void **)itemActivated,0,3), !bVar2 &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                             ((QtMocHelpers *)_a,(void **)itemEntered,0,4), !bVar2)))) &&
        ((bVar2 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QListWidgetItem*)>
                            ((QtMocHelpers *)_a,(void **)itemChanged,0,5), !bVar2 &&
         ((bVar2 = QtMocHelpers::
                   indexOfMethod<void(QListWidget::*)(QListWidgetItem*,QListWidgetItem*)>
                             ((QtMocHelpers *)_a,(void **)currentItemChanged,0,6), !bVar2 &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(QString_const&)>
                             ((QtMocHelpers *)_a,(void **)currentTextChanged,0,7), !bVar2)))))) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QListWidget::*)(int)>
                          ((QtMocHelpers *)_a,(void **)currentRowChanged,0,8), !bVar2)) {
      QtMocHelpers::indexOfMethod<void(QListWidget::*)()>
                ((QtMocHelpers *)_a,(void **)itemSelectionChanged,0,9);
      return;
    }
  }
switchD_005227cb_caseD_3:
  return;
}

Assistant:

void QListWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QListWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 6: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[2]))); break;
        case 7: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->currentRowChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->itemSelectionChanged(); break;
        case 10: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QListWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 11: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QListWidgetItem*>>(_a[1]))); break;
        case 12: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * , QListWidgetItem * )>(_a, &QListWidget::currentItemChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(const QString & )>(_a, &QListWidget::currentTextChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(int )>(_a, &QListWidget::currentRowChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)()>(_a, &QListWidget::itemSelectionChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->currentRow(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setCurrentRow(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}